

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDateTime __thiscall QDateTime::addMonths(QDateTime *this,int nmonths)

{
  long lVar1;
  bool bVar2;
  QDate date;
  QDateTimeData *in_RSI;
  Data in_RDI;
  long in_FS_OFFSET;
  pair<QDate,_QTime> pVar3;
  QDateTime *dt;
  pair<QDate,_QTime> p;
  QDateTime *in_stack_ffffffffffffff58;
  QDateTime *in_stack_ffffffffffffff60;
  QDateTimeData *in_stack_ffffffffffffff70;
  Data DVar4;
  QTime in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DVar4 = in_RDI;
  bVar2 = isNull(in_stack_ffffffffffffff60);
  if (bVar2) {
    QDateTime((QDateTime *)0x571666);
  }
  else {
    *(undefined1 **)in_RDI.d = &DAT_aaaaaaaaaaaaaaaa;
    QDateTime(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    pVar3 = getDateTime(in_stack_ffffffffffffff70);
    date = pVar3.first.jd;
    QDate::addMonths((QDate *)&in_stack_ffffffffffffff70->data,in_RDI._4_4_);
    massageAdjustedDateTime(in_RSI,date,in_stack_ffffffffffffffe4,DVar4._7_1_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDateTime)DVar4;
}

Assistant:

QDateTime QDateTime::addMonths(int nmonths) const
{
    if (isNull())
        return QDateTime();

    QDateTime dt(*this);
    std::pair<QDate, QTime> p = getDateTime(d);
    massageAdjustedDateTime(dt.d, p.first.addMonths(nmonths), p.second, nmonths >= 0);
    return dt;
}